

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e2.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  int iVar2;
  istream *piVar3;
  ostream *poVar4;
  int *piVar5;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  istream *local_70;
  ulong local_68;
  undefined1 *local_60;
  int local_58;
  int local_54;
  int j_1;
  int i_2;
  int localmax;
  int i_1;
  int j;
  int i;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  int local_28;
  int local_24;
  int c2;
  int r2;
  int c1;
  int r1;
  int r;
  int y;
  int x;
  
  y = 0;
  local_70 = (istream *)&std::cin;
  uStack_80 = 0x1011f3;
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&r);
  uStack_80 = 0x1011ff;
  std::istream::operator>>(piVar3,&r1);
  uStack_80 = 0x10120c;
  std::istream::operator>>(local_70,&c1);
  __vla_expr1 = (unsigned_long)(uint)r;
  local_68 = (ulong)(uint)r1;
  lVar1 = -(__vla_expr1 * local_68 * 4 + 0xf & 0xfffffffffffffff0);
  local_60 = auStack_78 + lVar1;
  _j = local_68;
  __vla_expr0 = (unsigned_long)auStack_78;
  for (i_1 = 0; i_1 < r; i_1 = i_1 + 1) {
    for (localmax = 0; localmax < r1; localmax = localmax + 1) {
      piVar5 = (int *)(local_60 + (long)localmax * 4 + (long)i_1 * local_68 * 4);
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x101293;
      std::istream::operator>>((istream *)&std::cin,piVar5);
    }
  }
  for (i_2 = 0; i_2 < c1; i_2 = i_2 + 1) {
    *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1012ce;
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&r2);
    *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1012da;
    piVar3 = (istream *)std::istream::operator>>(piVar3,&c2);
    *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1012e6;
    piVar3 = (istream *)std::istream::operator>>(piVar3,&local_24);
    *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x1012f2;
    std::istream::operator>>(piVar3,&local_28);
    if ((local_24 < r2) || (local_28 < c2)) {
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x101315;
      std::operator<<((ostream *)&std::cout,"INVALID\n");
    }
    else if ((r < r2) || (r1 < c2)) {
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x10133d;
      poVar4 = std::operator<<((ostream *)&std::cout,"OUTSIDE");
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x10134c;
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (r < local_24) {
        local_24 = r;
      }
      if (r1 < local_28) {
        local_28 = r1;
      }
      j_1 = *(int *)(local_60 + (long)(c2 + -1) * 4 + (long)(r2 + -1) * local_68 * 4);
      for (local_54 = r2 + -1; iVar2 = j_1, local_54 < local_24; local_54 = local_54 + 1) {
        for (local_58 = c2 + -1; local_58 < local_28; local_58 = local_58 + 1) {
          if (j_1 < *(int *)(local_60 + (long)local_58 * 4 + (long)local_54 * local_68 * 4)) {
            j_1 = *(int *)(local_60 + (long)local_58 * 4 + (long)local_54 * local_68 * 4);
          }
        }
      }
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x101427;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      *(undefined8 *)(auStack_78 + lVar1 + -8) = 0x101436;
      std::operator<<(poVar4,"\n");
    }
  }
  return y;
}

Assistant:

int main() {
    int x, y;
    cin >> x >> y;
    int r, r1, c1, r2, c2;
    cin >> r;
    int arr[x][y];
    for (int i = 0; i < x; i++) {
        for (int j = 0; j < y; j++) {
            cin >> arr[i][j];
        }
    }

    for (int i = 0; i < r; i++) {
        cin >> r1 >> c1 >> r2 >> c2;
        if (r1 > r2 || c1 > c2) {
            cout << "INVALID\n";
        } else if (r1 > x || c1 > y) {
            cout << "OUTSIDE" << endl;
        } else {
            if (r2 > x)
                r2 = x;
            if (c2 > y)
                c2 = y;
            int localmax = arr[r1 - 1][c1 - 1];
            for (int i = r1 - 1; i < r2; i++) {
                for (int j = c1 - 1; j < c2; j++) {
                    if (arr[i][j] > localmax) {
                        localmax = arr[i][j];
                    }
                }
            }
            cout << localmax << "\n";
        }
    }
}